

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
::size_of(PropertyT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
          *this)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  
  lVar1 = (**(code **)(*(long *)this + 0x60))();
  if (lVar1 == -1) {
    sVar4 = (long)(this->data_).
                  super__Vector_base<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
                  ._M_impl.super__Vector_impl_data._M_start -
            (long)(this->data_).
                  super__Vector_base<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    sVar3 = 0;
    if (sVar4 != 0) {
      sVar3 = sVar4;
    }
  }
  else {
    lVar1 = (**(code **)(*(long *)this + 0x58))(this);
    lVar2 = (**(code **)(*(long *)this + 0x60))(this);
    if (lVar2 == -1) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      lVar2 = (**(code **)(*(long *)this + 0x60))(this);
      sVar3 = lVar2 * lVar1;
    }
  }
  return sVar3;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }